

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_result_t result)

{
  char *pcVar1;
  string local_30;
  
  switch(result) {
  case ZE_RESULT_ERROR_UNINITIALIZED:
    pcVar1 = "ZE_RESULT_ERROR_UNINITIALIZED";
    break;
  case ZE_RESULT_ERROR_UNSUPPORTED_VERSION:
    pcVar1 = "ZE_RESULT_ERROR_UNSUPPORTED_VERSION";
    break;
  case ZE_RESULT_ERROR_UNSUPPORTED_FEATURE:
    pcVar1 = "ZE_RESULT_ERROR_UNSUPPORTED_FEATURE";
    break;
  case ZE_RESULT_ERROR_INVALID_ARGUMENT:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_ARGUMENT";
    break;
  case ZE_RESULT_ERROR_INVALID_NULL_HANDLE:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_NULL_HANDLE";
    break;
  case ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE:
    pcVar1 = "ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE";
    break;
  case ZE_RESULT_ERROR_INVALID_NULL_POINTER:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_NULL_POINTER";
    break;
  case ZE_RESULT_ERROR_INVALID_SIZE:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_SIZE";
    break;
  case ZE_RESULT_ERROR_UNSUPPORTED_SIZE:
    pcVar1 = "ZE_RESULT_ERROR_UNSUPPORTED_SIZE";
    break;
  case ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT:
    pcVar1 = "ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT";
    break;
  case ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT";
    break;
  case ZE_RESULT_ERROR_INVALID_ENUMERATION:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_ENUMERATION";
    break;
  case ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION:
    pcVar1 = "ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION";
    break;
  case ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT:
    pcVar1 = "ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT";
    break;
  case ZE_RESULT_ERROR_INVALID_NATIVE_BINARY:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_NATIVE_BINARY";
    break;
  case ZE_RESULT_ERROR_INVALID_GLOBAL_NAME:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_GLOBAL_NAME";
    break;
  case ZE_RESULT_ERROR_INVALID_KERNEL_NAME:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_KERNEL_NAME";
    break;
  case ZE_RESULT_ERROR_INVALID_FUNCTION_NAME:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_FUNCTION_NAME";
    break;
  case ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION";
    break;
  case ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION";
    break;
  case ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX";
    break;
  case ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE";
    break;
  case ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE";
    break;
  case ZE_RESULT_ERROR_INVALID_MODULE_UNLINKED:
switchD_00105236_caseD_78000018:
    std::__cxx11::to_string(&local_30,result);
    std::operator+(__return_storage_ptr__,"Unknown ze_result_t value: ",&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return __return_storage_ptr__;
  case ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE";
    break;
  case ZE_RESULT_ERROR_OVERLAPPING_REGIONS:
    pcVar1 = "ZE_RESULT_ERROR_OVERLAPPING_REGIONS";
    break;
  default:
    switch(result) {
    case ZE_RESULT_ERROR_DEVICE_LOST:
      pcVar1 = "ZE_RESULT_ERROR_DEVICE_LOST";
      break;
    case ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY:
      pcVar1 = "ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY";
      break;
    case ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY:
      pcVar1 = "ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY";
      break;
    case ZE_RESULT_ERROR_MODULE_BUILD_FAILURE:
      pcVar1 = "ZE_RESULT_ERROR_MODULE_BUILD_FAILURE";
      break;
    default:
      if (result == ZE_RESULT_ERROR_UNKNOWN) {
        pcVar1 = "ZE_RESULT_ERROR_UNKNOWN";
      }
      else if (result == ZE_RESULT_NOT_READY) {
        pcVar1 = "ZE_RESULT_NOT_READY";
      }
      else if (result == ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS) {
        pcVar1 = "ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS";
      }
      else if (result == ZE_RESULT_ERROR_NOT_AVAILABLE) {
        pcVar1 = "ZE_RESULT_ERROR_NOT_AVAILABLE";
      }
      else {
        if (result != ZE_RESULT_SUCCESS) goto switchD_00105236_caseD_78000018;
        pcVar1 = "ZE_RESULT_SUCCESS";
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_result_t result) {
  if (result == ZE_RESULT_SUCCESS) {
    return "ZE_RESULT_SUCCESS";
  } else if (result == ZE_RESULT_NOT_READY) {
    return "ZE_RESULT_NOT_READY";
  } else if (result == ZE_RESULT_ERROR_UNINITIALIZED) {
    return "ZE_RESULT_ERROR_UNINITIALIZED";
  } else if (result == ZE_RESULT_ERROR_DEVICE_LOST) {
    return "ZE_RESULT_ERROR_DEVICE_LOST";
  } else if (result == ZE_RESULT_ERROR_INVALID_ARGUMENT) {
    return "ZE_RESULT_ERROR_INVALID_ARGUMENT";
  } else if (result == ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY) {
    return "ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY";
  } else if (result == ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY) {
    return "ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY";
  } else if (result == ZE_RESULT_ERROR_MODULE_BUILD_FAILURE) {
    return "ZE_RESULT_ERROR_MODULE_BUILD_FAILURE";
  } else if (result == ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS) {
    return "ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS";
  } else if (result == ZE_RESULT_ERROR_NOT_AVAILABLE) {
    return "ZE_RESULT_ERROR_NOT_AVAILABLE";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_VERSION) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_VERSION";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_FEATURE) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_FEATURE";
  } else if (result == ZE_RESULT_ERROR_INVALID_NULL_HANDLE) {
    return "ZE_RESULT_ERROR_INVALID_NULL_HANDLE";
  } else if (result == ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE) {
    return "ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE";
  } else if (result == ZE_RESULT_ERROR_INVALID_NULL_POINTER) {
    return "ZE_RESULT_ERROR_INVALID_NULL_POINTER";
  } else if (result == ZE_RESULT_ERROR_INVALID_SIZE) {
    return "ZE_RESULT_ERROR_INVALID_SIZE";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_SIZE) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_SIZE";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT";
  } else if (result == ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT) {
    return "ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT";
  } else if (result == ZE_RESULT_ERROR_INVALID_ENUMERATION) {
    return "ZE_RESULT_ERROR_INVALID_ENUMERATION";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT";
  } else if (result == ZE_RESULT_ERROR_INVALID_NATIVE_BINARY) {
    return "ZE_RESULT_ERROR_INVALID_NATIVE_BINARY";
  } else if (result == ZE_RESULT_ERROR_INVALID_GLOBAL_NAME) {
    return "ZE_RESULT_ERROR_INVALID_GLOBAL_NAME";
  } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_NAME) {
    return "ZE_RESULT_ERROR_INVALID_KERNEL_NAME";
  } else if (result == ZE_RESULT_ERROR_INVALID_FUNCTION_NAME) {
    return "ZE_RESULT_ERROR_INVALID_FUNCTION_NAME";
  } else if (result == ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION) {
    return "ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION";
  } else if (result == ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION) {
    return "ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION";
  } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX) {
    return "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX";
  } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE) {
    return "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE";
  } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE) {
    return "ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE";
  } else if (result == ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE) {
    return "ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE";
  } else if (result == ZE_RESULT_ERROR_OVERLAPPING_REGIONS) {
    return "ZE_RESULT_ERROR_OVERLAPPING_REGIONS";
  } else if (result == ZE_RESULT_ERROR_UNKNOWN) {
    return "ZE_RESULT_ERROR_UNKNOWN";
  } else {
    return "Unknown ze_result_t value: " +
      std::to_string(static_cast<int>(result));
  }
}